

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr_acl.c
# Opt level: O2

int netaddr_acl_handle_keywords(netaddr_acl *acl,char *cmd)

{
  int iVar1;
  
  iVar1 = strcasecmp(cmd,"default_accept");
  if (iVar1 == 0) {
    acl->accept_default = true;
  }
  else {
    iVar1 = strcasecmp(cmd,"default_reject");
    if (iVar1 == 0) {
      acl->accept_default = false;
    }
    else {
      iVar1 = strcasecmp(cmd,"first_accept");
      if (iVar1 == 0) {
        acl->reject_first = false;
      }
      else {
        iVar1 = strcasecmp(cmd,"first_reject");
        if (iVar1 != 0) {
          return -1;
        }
        acl->reject_first = true;
      }
    }
  }
  return 0;
}

Assistant:

int
netaddr_acl_handle_keywords(struct netaddr_acl *acl, const char *cmd) {
  if (strcasecmp(cmd, ACL_DEFAULT_ACCEPT) == 0) {
    acl->accept_default = true;
  }
  else if (strcasecmp(cmd, ACL_DEFAULT_REJECT) == 0) {
    acl->accept_default = false;
  }
  else if (strcasecmp(cmd, ACL_FIRST_ACCEPT) == 0) {
    acl->reject_first = false;
  }
  else if (strcasecmp(cmd, ACL_FIRST_REJECT) == 0) {
    acl->reject_first = true;
  }
  else {
    /* no control command, must be an address */
    return -1;
  }

  /* was one of the four valid control commands */
  return 0;
}